

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinusExpression.cpp
# Opt level: O1

BaseExpressionPtr __thiscall
Kandinsky::MinusExpression::derivative(MinusExpression *this,VariableExpressionPtr *variable)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  element_type *peVar1;
  undefined **ppuVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  BaseExpressionPtr BVar3;
  MinusExpression local_38;
  shared_ptr<Kandinsky::BaseExpression> local_20;
  
  (*((variable->super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>).
     _M_refcount._M_pi)->_vptr__Sp_counted_base[1])(&local_20);
  operator-<std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>(&local_38,&local_20);
  peVar1 = (element_type *)operator_new(0x28);
  peVar1[1]._vptr_BaseExpression = (_func_int **)0x100000001;
  peVar1->_vptr_BaseExpression = (_func_int **)&PTR___Sp_counted_ptr_inplace_00117b10;
  ppuVar2 = &PTR___cxa_pure_virtual_00117508;
  peVar1[2]._vptr_BaseExpression = (_func_int **)&PTR___cxa_pure_virtual_00117508;
  peVar1[3]._vptr_BaseExpression =
       (_func_int **)
       local_38.super_UnaryExpression.m_arg.
       super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar1[4]._vptr_BaseExpression =
       (_func_int **)
       local_38.super_UnaryExpression.m_arg.
       super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_38.super_UnaryExpression.m_arg.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.super_UnaryExpression.m_arg.
       super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_38.super_UnaryExpression.m_arg.
            super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38.super_UnaryExpression.m_arg.
       super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_38.super_UnaryExpression.m_arg.
            super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  peVar1[2]._vptr_BaseExpression = (_func_int **)&PTR_evaluate_00117bb0;
  (this->super_UnaryExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)(peVar1 + 2);
  (this->super_UnaryExpression).m_arg.
  super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  local_38.super_UnaryExpression.super_BaseExpression._vptr_BaseExpression =
       (_func_int **)&PTR___cxa_pure_virtual_00117508;
  if (local_38.super_UnaryExpression.m_arg.
      super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super_UnaryExpression.m_arg.
               super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    ppuVar2 = (undefined **)extraout_RDX;
  }
  if (local_20.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    ppuVar2 = (undefined **)extraout_RDX_00;
  }
  BVar3.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppuVar2;
  BVar3.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (BaseExpressionPtr)
         BVar3.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

BaseExpressionPtr MinusExpression::derivative(const VariableExpressionPtr& variable) const
    {
        return makePtr(- m_arg->derivative(variable));
    }